

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::TraceOfProduct::dim_forward
          (TraceOfProduct *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  initializer_list<unsigned_int> x;
  bool bVar1;
  size_type sVar2;
  ostream *this_00;
  invalid_argument *this_01;
  const_reference pvVar3;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  Dim *in_RDI;
  Dim *in_stack_ffffffffffffff98;
  Dim *in_stack_ffffffffffffffa0;
  uint *__a;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_stack_ffffffffffffffa8;
  const_reference in_stack_ffffffffffffffb0;
  uint b;
  Dim *this_02;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar4;
  undefined1 *puVar5;
  
  this_02 = in_RDI;
  sVar2 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  b = (uint)((ulong)in_RDI >> 0x20);
  if (sVar2 == 2) {
    in_stack_ffffffffffffffb0 =
         std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
    std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,1);
    bVar1 = cnn::operator!=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (!bVar1) {
      uVar4 = 1;
      puVar5 = &stack0xffffffffffffffcc;
      pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
      __a = &pvVar3->bd;
      pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,1);
      std::max<unsigned_int>(__a,&pvVar3->bd);
      x._M_array._4_4_ = uVar4;
      x._M_array._0_4_ = in_stack_ffffffffffffffc8;
      x._M_len = (size_type)puVar5;
      Dim::Dim(this_02,x,b);
      return this_02;
    }
  }
  std::operator<<((ostream *)&std::cerr,"Bad arguments in TraceOfProduct: ");
  this_00 = cnn::operator<<((ostream *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"invalid arguments to TraceOfProduct");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim TraceOfProduct::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2 || xs[0] != xs[1]) {
    cerr << "Bad arguments in TraceOfProduct: " << xs << endl;
    throw std::invalid_argument("invalid arguments to TraceOfProduct");
  }
  return Dim({1}, max(xs[0].bd, xs[1].bd));
}